

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeDataViewConstructor
               (DynamicObject *dataViewConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  Var value;
  JavascriptLibrary *pJVar1;
  DynamicObject **ppDVar2;
  PropertyString *value_00;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *dataViewConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,dataViewConstructor,mode,3,0);
  this = RecyclableObject::GetScriptContext(&dataViewConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&dataViewConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(3);
  AddMember(this_00,dataViewConstructor,0xd1,value,'\x02');
  pJVar1 = ScriptContext::GetLibrary(this);
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(pJVar1->super_JavascriptLibraryBase).dataViewPrototype);
  AddMember(this_00,dataViewConstructor,0x124,*ppDVar2,'\0');
  value_00 = ScriptContext::GetPropertyString(this,0x1ba);
  AddMember(this_00,dataViewConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(dataViewConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeDataViewConstructor(DynamicObject* dataViewConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(dataViewConstructor, mode, 3);

        ScriptContext* scriptContext = dataViewConstructor->GetScriptContext();
        JavascriptLibrary* library = dataViewConstructor->GetLibrary();
        library->AddMember(dataViewConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(3), PropertyConfigurable);
        library->AddMember(dataViewConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->dataViewPrototype, PropertyNone);
        library->AddMember(dataViewConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::DataView), PropertyConfigurable);

        dataViewConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }